

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

optional<std::shared_ptr<WhileStatementAstNode>_> * __thiscall
Parser::parseWhileStatement
          (optional<std::shared_ptr<WhileStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  shared_ptr<ExpressionAstNode> *__args_1;
  TokenType type;
  byte local_161;
  shared_ptr<ExpressionAstNode> local_110;
  undefined4 local_100;
  undefined1 local_f8 [8];
  optional<std::shared_ptr<StatementAstNode>_> statement;
  string local_d8 [32];
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  string local_88 [32];
  undefined1 local_68 [24];
  string local_50 [32];
  undefined1 local_30 [23];
  undefined1 local_19 [8];
  bool error;
  Parser *this_local;
  
  local_19[0] = (_Alloc_hider)0x0;
  unique0x10000488 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"Expected a while",(allocator<char> *)(local_68 + 0x17));
  type = (TokenType)this;
  expect((Parser *)local_30,type,(bool *)0xf,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x17));
  skipWhiteSpace(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"Expected a left paren after while",
             (allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  expect((Parser *)local_68,type,(bool *)0x5,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8,this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"Expected a right paren after expression of while",
             (allocator<char> *)
             &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
  expect((Parser *)local_b8,type,(bool *)0x6,(string *)local_19);
  std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>.field_0x17);
  parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)local_f8,this);
  local_161 = 1;
  if (((byte)local_19[0] & 1) == 0) {
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_a8);
    local_161 = 1;
    if (bVar1) {
      bVar1 = std::optional::operator_cast_to_bool((optional *)local_f8);
      local_161 = bVar1 ^ 0xff;
    }
  }
  local_19[0] = (_Alloc_hider)(local_161 & 1);
  if (local_19[0] == (_Alloc_hider)0x0) {
    __args_1 = std::optional<std::shared_ptr<ExpressionAstNode>_>::value
                         ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
    std::optional<std::shared_ptr<StatementAstNode>_>::value
              ((optional<std::shared_ptr<StatementAstNode>_> *)local_f8);
    std::
    make_shared<WhileStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&>
              (&local_110,(shared_ptr<StatementAstNode> *)__args_1);
    std::optional<std::shared_ptr<WhileStatementAstNode>_>::
    optional<std::shared_ptr<WhileStatementAstNode>,_true>
              (__return_storage_ptr__,(shared_ptr<WhileStatementAstNode> *)&local_110);
    std::shared_ptr<WhileStatementAstNode>::~shared_ptr
              ((shared_ptr<WhileStatementAstNode> *)&local_110);
  }
  else {
    std::optional<std::shared_ptr<WhileStatementAstNode>_>::optional(__return_storage_ptr__);
  }
  local_100 = 1;
  std::optional<std::shared_ptr<StatementAstNode>_>::~optional
            ((optional<std::shared_ptr<StatementAstNode>_> *)local_f8);
  std::optional<std::shared_ptr<ExpressionAstNode>_>::~optional
            ((optional<std::shared_ptr<ExpressionAstNode>_> *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<WhileStatementAstNode>>
Parser::parseWhileStatement() noexcept {
  bool error = false;

  this->expect(TokenType::While, error, "Expected a while");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected a left paren after while");

  auto expression = this->parseExpression();

  this->expect(TokenType::RightParen, error, "Expected a right paren after expression of while");

  auto statement = this->parseStatement();

  error = error || !expression || !statement;

  if (error) { return std::nullopt; }

  return std::make_shared<WhileStatementAstNode>(expression.value(), statement.value());
}